

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_float(flatcc_json_parser_t *ctx,char *buf,char *end,float *v)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  double v_1;
  double local_30;
  
  *v = 0.0;
  if (buf == end) {
    return buf;
  }
  pcVar2 = buf + (*buf == '-');
  if (((long)end - (long)pcVar2 < 2) ||
     ((*pcVar2 != '.' && ((*pcVar2 != '0' || (pcVar2[1] != '0')))))) {
    pcVar2 = parse_double(buf,(long)end - (long)buf,&local_30);
    fVar3 = (float)local_30;
    if (ABS(fVar3) == INFINITY) {
      fVar3 = *(float *)(&DAT_00138370 + (ulong)(local_30 < 0.0) * 4);
      pcVar2 = buf;
    }
    *v = fVar3;
    if (pcVar2 != (char *)0x0 && pcVar2 != buf) {
      return pcVar2;
    }
    iVar1 = ctx->error;
    if (ABS(fVar3) == INFINITY) {
      if (iVar1 != 0) {
        return end;
      }
      ctx->error = 7;
      goto LAB_00122c52;
    }
  }
  else {
    iVar1 = ctx->error;
  }
  if (iVar1 != 0) {
    return end;
  }
  ctx->error = 6;
LAB_00122c52:
  ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = buf;
  return end;
}

Assistant:

const char *flatcc_json_parser_float(flatcc_json_parser_t *ctx, const char *buf, const char *end, float *v)
{
    const char *next, *k;

    *v = 0.0;
    if (buf == end) {
        return buf;
    }
    k = buf;
    if (*buf == '-') ++k;
    if (end - k > 1 && (k[0] == '.' || (k[0] == '0' && k[1] == '0'))) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_numeric);
    }
    next = parse_float(buf, (size_t)(end - buf), v);
    if (next == 0 || next == buf) {
        if (parse_float_isinf(*v)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_overflow);
        }
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_numeric);
    }
    return next;
}